

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBUnattenuateRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int32_t iVar5;
  int in_EDX;
  undefined1 *in_RSI;
  byte *in_RDI;
  uint32_t ia;
  uint32_t a;
  uint32_t r;
  uint32_t g;
  uint32_t b;
  int i;
  int local_18;
  undefined1 *local_10;
  byte *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    bVar1 = local_8[1];
    bVar2 = local_8[2];
    bVar3 = local_8[3];
    uVar4 = fixed_invtbl8[bVar3] & 0xffff;
    iVar5 = libyuv::clamp255(*local_8 * uVar4 >> 8);
    *local_10 = (char)iVar5;
    iVar5 = libyuv::clamp255(bVar1 * uVar4 >> 8);
    local_10[1] = (char)iVar5;
    iVar5 = libyuv::clamp255(bVar2 * uVar4 >> 8);
    local_10[2] = (char)iVar5;
    local_10[3] = bVar3;
    local_8 = local_8 + 4;
    local_10 = local_10 + 4;
  }
  return;
}

Assistant:

void ARGBUnattenuateRow_C(const uint8_t* src_argb,
                          uint8_t* dst_argb,
                          int width) {
  int i;
  for (i = 0; i < width; ++i) {
    uint32_t b = src_argb[0];
    uint32_t g = src_argb[1];
    uint32_t r = src_argb[2];
    const uint32_t a = src_argb[3];
    const uint32_t ia = fixed_invtbl8[a] & 0xffff;  // 8.8 fixed point
    b = (b * ia) >> 8;
    g = (g * ia) >> 8;
    r = (r * ia) >> 8;
    // Clamping should not be necessary but is free in assembly.
    dst_argb[0] = clamp255(b);
    dst_argb[1] = clamp255(g);
    dst_argb[2] = clamp255(r);
    dst_argb[3] = a;
    src_argb += 4;
    dst_argb += 4;
  }
}